

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

void __thiscall
jbcoin::STAmount::STAmount
          (STAmount *this,SField *name,Issue *issue,mantissa_type mantissa,exponent_type exponent,
          bool native,bool negative)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool negative_local;
  bool native_local;
  exponent_type exponent_local;
  mantissa_type mantissa_local;
  Issue *issue_local;
  SField *name_local;
  STAmount *this_local;
  
  STBase::STBase(&this->super_STBase,name);
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STAmount_00519e68;
  *(undefined8 *)((this->mIssue).account.pn + 3) = *(undefined8 *)((issue->account).pn + 3);
  uVar1 = *(undefined8 *)(issue->currency).pn;
  uVar2 = *(undefined8 *)((issue->currency).pn + 2);
  uVar3 = *(undefined8 *)((issue->account).pn + 1);
  *(undefined8 *)((this->mIssue).currency.pn + 4) = *(undefined8 *)((issue->currency).pn + 4);
  *(undefined8 *)((this->mIssue).account.pn + 1) = uVar3;
  *(undefined8 *)(this->mIssue).currency.pn = uVar1;
  *(undefined8 *)((this->mIssue).currency.pn + 2) = uVar2;
  this->mValue = mantissa;
  this->mOffset = exponent;
  this->mIsNative = native;
  this->mIsNegative = negative;
  canonicalize(this);
  return;
}

Assistant:

STAmount::STAmount (SField const& name, Issue const& issue,
        mantissa_type mantissa, exponent_type exponent,
            bool native, bool negative)
    : STBase (name)
    , mIssue (issue)
    , mValue (mantissa)
    , mOffset (exponent)
    , mIsNative (native)
    , mIsNegative (negative)
{
    canonicalize();
}